

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_375::NinjaMain::ToolRules(NinjaMain *this,Options *options,int argc,char **argv)

{
  Rule *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  pointer ppVar5;
  EvalString *this_01;
  string local_b8;
  allocator<char> local_81;
  string local_80;
  EvalString *local_60;
  EvalString *description;
  Rule *rule;
  _Self local_48;
  const_iterator i;
  Rules *rules;
  int opt;
  bool print_description;
  char **argv_local;
  int argc_local;
  Options *options_local;
  NinjaMain *this_local;
  
  bVar1 = false;
  _optind = 1;
  while( true ) {
    iVar3 = getopt(argc + 1,argv + -1,"hd");
    if (iVar3 == -1) {
      i._M_node = (_Base_ptr)BindingEnv::GetRules_abi_cxx11_(&(this->state_).bindings_);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
                    *)i._M_node);
      while( true ) {
        rule = (Rule *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
                       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
                              *)i._M_node);
        bVar2 = std::operator!=(&local_48,(_Self *)&rule);
        if (!bVar2) break;
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>
        ::operator->(&local_48);
        uVar4 = std::__cxx11::string::c_str();
        printf("%s",uVar4);
        if (bVar1) {
          ppVar5 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>
                   ::operator->(&local_48);
          this_00 = ppVar5->second;
          description = (EvalString *)this_00;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"description",&local_81);
          this_01 = Rule::GetBinding(this_00,&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::allocator<char>::~allocator(&local_81);
          local_60 = this_01;
          if (this_01 != (EvalString *)0x0) {
            EvalString::Unparse_abi_cxx11_(&local_b8,this_01);
            uVar4 = std::__cxx11::string::c_str();
            printf(": %s",uVar4);
            std::__cxx11::string::~string((string *)&local_b8);
          }
        }
        printf("\n");
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>
        ::operator++(&local_48);
      }
      return 0;
    }
    if (iVar3 != 100) break;
    bVar1 = true;
  }
  printf(
        "usage: ninja -t rules [options]\n\noptions:\n  -d     also print the description of the rule\n  -h     print this message\n"
        );
  return 1;
}

Assistant:

int NinjaMain::ToolRules(const Options* options, int argc, char* argv[]) {
  // Parse options.

  // The rules tool uses getopt, and expects argv[0] to contain the name of
  // the tool, i.e. "rules".
  argc++;
  argv--;

  bool print_description = false;

  optind = 1;
  int opt;
  while ((opt = getopt(argc, argv, const_cast<char*>("hd"))) != -1) {
    switch (opt) {
    case 'd':
      print_description = true;
      break;
    case 'h':
    default:
      printf("usage: ninja -t rules [options]\n"
             "\n"
             "options:\n"
             "  -d     also print the description of the rule\n"
             "  -h     print this message\n"
             );
    return 1;
    }
  }
  argv += optind;
  argc -= optind;

  // Print rules

  typedef map<string, const Rule*> Rules;
  const Rules& rules = state_.bindings_.GetRules();
  for (Rules::const_iterator i = rules.begin(); i != rules.end(); ++i) {
    printf("%s", i->first.c_str());
    if (print_description) {
      const Rule* rule = i->second;
      const EvalString* description = rule->GetBinding("description");
      if (description != NULL) {
        printf(": %s", description->Unparse().c_str());
      }
    }
    printf("\n");
  }
  return 0;
}